

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>::
resize(vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
       *this,size_type n)

{
  undefined8 *puVar1;
  memory_resource *pmVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  if (n < this->nStored) {
    if (n == 0) {
      if (this->ptr != (DigitPermutation *)0x0) {
        pmVar2 = (this->alloc).memoryResource;
        (*pmVar2->_vptr_memory_resource[3])(pmVar2,this->ptr,this->nAlloc << 4,8);
      }
      this->ptr = (DigitPermutation *)0x0;
      this->nAlloc = 0;
    }
  }
  else if (this->nStored < n) {
    reserve(this,n);
    uVar3 = this->nStored;
    lVar5 = n - uVar3;
    if (uVar3 <= n && lVar5 != 0) {
      lVar4 = uVar3 << 4;
      do {
        puVar1 = (undefined8 *)((long)&this->ptr->base + lVar4);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar4 = lVar4 + 0x10;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  this->nStored = n;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; i < size(); ++i)
                alloc.destroy(ptr + i);
            if (n == 0) {
                alloc.deallocate_object(ptr, nAlloc);
                ptr = nullptr;
                nAlloc = 0;
            }
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(ptr + i);
        }
        nStored = n;
    }